

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<11,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  Matrix<float,_2,_4> *pMVar3;
  undefined4 *puVar4;
  Matrix<float,_2,_4> *pMVar5;
  Matrix<float,_2,_4> *mat;
  bool bVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  Type in0;
  float afStack_c8 [6];
  float local_b0 [6];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_70 [6];
  Matrix<float,_2,_4> local_58;
  Matrix<float,_2,_4> local_38;
  
  puVar1 = &local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pMVar3 = (Matrix<float,_2,_4> *)0x0;
    do {
      pMVar5 = (Matrix<float,_2,_4> *)0x0;
      do {
        uVar7 = 0x3f800000;
        if (pMVar3 != pMVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)(puVar1 + (long)pMVar5) = uVar7;
        pMVar5 = (Matrix<float,_2,_4> *)((long)(pMVar5->m_data).m_data[0].m_data + 1);
      } while (pMVar5 != (Matrix<float,_2,_4> *)0x4);
      pMVar5 = (Matrix<float,_2,_4> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      bVar6 = pMVar3 == (Matrix<float,_2,_4> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
    local_98 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_90 = *(undefined8 *)evalCtx->in[1].m_data;
    local_88 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_80 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x2;
    pMVar3 = (Matrix<float,_2,_4> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)(puVar1 + lVar2) = puVar4[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      pMVar5 = (Matrix<float,_2,_4> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 4;
      bVar6 = pMVar3 == (Matrix<float,_2,_4> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,4>
            (&local_38,(MatrixCaseUtils *)&local_98,pMVar5);
  local_b0[3] = local_38.m_data.m_data[0].m_data[0] + local_38.m_data.m_data[0].m_data[1] +
                local_38.m_data.m_data[3].m_data[0];
  local_b0[4] = local_38.m_data.m_data[1].m_data[0] + local_38.m_data.m_data[1].m_data[1] +
                local_38.m_data.m_data[3].m_data[1];
  local_b0[5] = local_38.m_data.m_data[2].m_data[0] + local_38.m_data.m_data[2].m_data[1];
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,4>
            (&local_58,(MatrixCaseUtils *)&local_98,mat);
  local_b0[0] = local_58.m_data.m_data[0].m_data[0] + local_58.m_data.m_data[0].m_data[1] +
                local_58.m_data.m_data[3].m_data[0];
  local_b0[1] = local_58.m_data.m_data[1].m_data[0] + local_58.m_data.m_data[1].m_data[1] +
                local_58.m_data.m_data[3].m_data[1];
  local_b0[2] = local_58.m_data.m_data[2].m_data[0] + local_58.m_data.m_data[2].m_data[1];
  afStack_c8[2] = 0.0;
  afStack_c8[3] = 0.0;
  afStack_c8[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_c8[lVar2 + 2] = local_b0[lVar2 + 3] + local_b0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_70[2] = 0;
  local_70[3] = 1;
  local_70[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_70[lVar2]] = afStack_c8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}